

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters::TreeEnsembleParameters
          (TreeEnsembleParameters *this,TreeEnsembleParameters *from)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleParameters_004048e8;
  google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::
  RepeatedPtrField(&this->nodes_,&from->nodes_);
  google::protobuf::RepeatedField<double>::RepeatedField
            (&this->basepredictionvalue_,&from->basepredictionvalue_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->numpredictiondimensions_ = from->numpredictiondimensions_;
  return;
}

Assistant:

TreeEnsembleParameters::TreeEnsembleParameters(const TreeEnsembleParameters& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      nodes_(from.nodes_),
      basepredictionvalue_(from.basepredictionvalue_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  numpredictiondimensions_ = from.numpredictiondimensions_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleParameters)
}